

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

int __thiscall
vector<server::clientinfo_*>::remove(vector<server::clientinfo_*> *this,char *__filename)

{
  clientinfo *pcVar1;
  int iVar2;
  int local_24;
  int p;
  clientinfo *e;
  int i_local;
  vector<server::clientinfo_*> *this_local;
  
  pcVar1 = this->buf[(int)__filename];
  iVar2 = (int)__filename;
  while (local_24 = iVar2 + 1, local_24 < this->ulen) {
    this->buf[iVar2] = this->buf[local_24];
    iVar2 = local_24;
  }
  this->ulen = this->ulen + -1;
  return (int)pcVar1;
}

Assistant:

T remove(int i)
    {
        T e = buf[i];
        for(int p = i+1; p<ulen; p++) buf[p-1] = buf[p];
        ulen--;
        return e;
    }